

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  undefined8 unaff_RBX;
  Mat *unaff_RBP;
  long in_RSI;
  long in_RDI;
  Mat *unaff_R14;
  Mat *unaff_R15;
  bool bVar2;
  Mat *unaff_retaddr;
  int ret;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  int in_stack_00000290;
  int in_stack_00000298;
  int in_stack_000002a0;
  int in_stack_000002a8;
  int in_stack_000002b0;
  Mat *in_stack_000002b8;
  Option *in_stack_000002c0;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined8 in_stack_fffffffffffffe20;
  int _c;
  undefined8 in_stack_fffffffffffffe28;
  int _w;
  Mat *in_stack_fffffffffffffe30;
  Mat *in_stack_fffffffffffffe38;
  void **ppvVar3;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  Deconvolution *in_stack_fffffffffffffe48;
  void *local_150;
  int *local_148;
  void *local_140;
  undefined4 local_138;
  long *local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  int local_118;
  void *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  int local_f0;
  int local_ec;
  void **local_e0;
  int local_c4;
  void **local_c0;
  void **local_b8;
  int local_a8;
  undefined4 local_a4;
  void **local_98;
  void **local_90;
  void **local_88;
  void **local_80;
  void **local_70;
  int local_58;
  undefined4 local_54;
  void **local_50;
  void *local_48;
  void **local_30;
  void **local_28;
  
  _c = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_ec = *(int *)(in_RSI + 0x2c);
  local_f0 = *(int *)(in_RSI + 0x30);
  local_f8 = *(undefined8 *)(in_RSI + 0x10);
  local_fc = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_100 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_104 = (local_ec + -1) * *(int *)(in_RDI + 0xe4) + local_fc + *(int *)(in_RDI + 0xfc);
  local_108 = (local_f0 + -1) * *(int *)(in_RDI + 0xe8) + local_100 + *(int *)(in_RDI + 0x100);
  local_c0 = &local_150;
  local_150 = (void *)0x0;
  local_148 = (int *)0x0;
  local_140 = (void *)0x0;
  local_138 = 0;
  local_130 = (long *)0x0;
  local_128 = 0;
  local_124 = 0;
  local_120 = 0;
  local_11c = 0;
  local_118 = 0;
  local_110 = (void *)0x0;
  _w = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_e0 = in_RDX;
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) &&
     ((*(int *)(in_RDI + 0xf8) < 1 &&
      ((*(int *)(in_RDI + 0x104) < 1 || (*(int *)(in_RDI + 0x108) < 1)))))) {
    local_98 = &local_150;
    if (local_98 != in_RDX) {
      if (in_RDX[1] != (void *)0x0) {
        piVar1 = (int *)in_RDX[1];
        local_a4 = 1;
        LOCK();
        local_a8 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_150 = *in_RDX;
      local_148 = (int *)in_RDX[1];
      local_140 = in_RDX[2];
      local_138 = *(undefined4 *)(in_RDX + 3);
      local_130 = (long *)in_RDX[4];
      local_128 = *(undefined4 *)(in_RDX + 5);
      local_124 = *(undefined4 *)((long)in_RDX + 0x2c);
      local_120 = *(undefined4 *)(in_RDX + 6);
      local_11c = *(undefined4 *)((long)in_RDX + 0x34);
      local_118 = *(int *)(in_RDX + 7);
      local_110 = in_RDX[8];
      local_70 = local_98;
    }
    local_90 = local_98;
    Mat::create(in_stack_fffffffffffffe30,_w,(int)in_stack_fffffffffffffe28,_c,
                CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                (Allocator *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  else {
    Mat::create(in_stack_fffffffffffffe30,_w,(int)in_stack_fffffffffffffe28,_c,
                CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                (Allocator *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  local_80 = &local_150;
  if (local_150 != (void *)0x0) {
    local_30 = local_80;
  }
  if (local_150 != (void *)0x0 && (long)local_110 * (long)local_118 != 0) {
    local_c4 = deconvolution(unaff_retaddr,unaff_RBP,unaff_R15,unaff_R14,
                             (int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,in_stack_00000290,
                             in_stack_00000298,in_stack_000002a0,in_stack_000002a8,in_stack_000002b0
                             ,in_stack_000002b8,in_stack_000002c0);
    if (local_c4 == 0) {
      cut_padding(in_stack_fffffffffffffe48,
                  (Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                  in_stack_fffffffffffffe38,(Option *)in_stack_fffffffffffffe30);
      local_88 = local_e0;
      bVar2 = true;
      if (*local_e0 != (void *)0x0) {
        local_28 = local_e0;
        bVar2 = (long)local_e0[8] * (long)*(int *)(local_e0 + 7) == 0;
      }
      if (bVar2) {
        local_c4 = -100;
      }
      else {
        local_c4 = 0;
      }
    }
  }
  else {
    local_c4 = -100;
  }
  ppvVar3 = &local_150;
  if (local_148 != (int *)0x0) {
    local_54 = 0xffffffff;
    LOCK();
    local_58 = *local_148;
    *local_148 = *local_148 + -1;
    UNLOCK();
    if (local_58 == 1) {
      local_b8 = ppvVar3;
      local_50 = ppvVar3;
      if (local_130 == (long *)0x0) {
        local_48 = local_150;
        if (local_150 != (void *)0x0) {
          free(local_150);
        }
      }
      else {
        (**(code **)(*local_130 + 0x18))(local_130,local_150);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_c4;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}